

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::OP_StObjSlotChkUndecl
          (InterpreterStackFrame *this,Var instance,int32 slotIndex,Var value)

{
  char *addr;
  DWORD DVar1;
  
  DVar1 = DynamicObject::GetOffsetOfAuxSlots();
  if (((((*(ScriptContext **)(this + 0x78))->super_ScriptContextBase).javascriptLibrary)->
      undeclBlockVarSentinel).ptr !=
      *(UndeclaredBlockVariable **)(*(long *)((long)instance + (ulong)DVar1) + (long)slotIndex * 8))
  {
    addr = (char *)(*(long *)((long)instance + (ulong)DVar1) + (long)slotIndex * 8);
    Memory::Recycler::WBSetBit(addr);
    *(Var *)addr = value;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    return;
  }
  JavascriptError::ThrowReferenceError(*(ScriptContext **)(this + 0x78),-0x7ff5ec07,(PCWSTR)0x0);
}

Assistant:

void InterpreterStackFrame::OP_StObjSlotChkUndecl(Var instance, int32 slotIndex, Var value)
    {
        // It would be nice to assert that it's ok to store directly to slot, but we don't have the propertyId.
        Field(Var) *slotArray = *(Field(Var)**)((char*)instance + DynamicObject::GetOffsetOfAuxSlots());
        OP_ChkUndecl(slotArray[slotIndex]);
        slotArray[slotIndex] = value;
    }